

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

int xmlXIncludeIncludeNode(xmlXIncludeCtxtPtr ctxt,xmlXIncludeRefPtr ref)

{
  _xmlNode *p_Var1;
  xmlNodePtr pxVar2;
  xmlNodePtr pxVar3;
  xmlNodePtr next;
  xmlNodePtr child;
  _xmlNode *p_Stack_40;
  int nb_elem;
  xmlNodePtr tmp;
  xmlNodePtr list;
  xmlNodePtr end;
  xmlNodePtr cur;
  xmlXIncludeRefPtr ref_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  if ((((ctxt != (xmlXIncludeCtxtPtr)0x0) && (ref != (xmlXIncludeRefPtr)0x0)) &&
      (pxVar3 = ref->elem, pxVar3 != (xmlNodePtr)0x0)) && (pxVar3->type != XML_NAMESPACE_DECL)) {
    tmp = ref->inc;
    ref->inc = (xmlNodePtr)0x0;
    if ((pxVar3->parent != (_xmlNode *)0x0) && (pxVar3->parent->type != XML_ELEMENT_NODE)) {
      child._4_4_ = 0;
      for (p_Stack_40 = tmp; p_Stack_40 != (xmlNodePtr)0x0; p_Stack_40 = p_Stack_40->next) {
        if (p_Stack_40->type == XML_ELEMENT_NODE) {
          child._4_4_ = child._4_4_ + 1;
        }
      }
      if (child._4_4_ != 1) {
        if (child._4_4_ < 2) {
          xmlXIncludeErr(ctxt,ref->elem,0x64b,"XInclude error: would result in no root node\n",
                         (xmlChar *)0x0);
        }
        else {
          xmlXIncludeErr(ctxt,ref->elem,0x64b,
                         "XInclude error: would result in multiple root nodes\n",(xmlChar *)0x0);
        }
        xmlFreeNodeList(tmp);
        return -1;
      }
    }
    p_Var1 = tmp;
    if ((ctxt->parseFlags & 0x8000U) == 0) {
      if (ref->fallback != 0) {
        xmlUnsetProp(pxVar3,"href");
      }
      pxVar3->type = XML_XINCLUDE_START;
      next = pxVar3->children;
      while (next != (xmlNodePtr)0x0) {
        p_Var1 = next->next;
        xmlUnlinkNode(next);
        xmlFreeNode(next);
        next = p_Var1;
      }
      pxVar2 = xmlNewDocNode(pxVar3->doc,pxVar3->ns,pxVar3->name,(xmlChar *)0x0);
      if (pxVar2 != (xmlNodePtr)0x0) {
        pxVar2->type = XML_XINCLUDE_END;
        pxVar3 = xmlAddNextSibling(pxVar3,pxVar2);
        p_Var1 = tmp;
        if (pxVar3 == (xmlNodePtr)0x0) {
          xmlFreeNode(pxVar2);
        }
        else {
          do {
            tmp = p_Var1;
            if (tmp == (xmlNodePtr)0x0) {
              return 0;
            }
            p_Var1 = tmp->next;
            pxVar3 = xmlAddPrevSibling(pxVar2,tmp);
          } while (pxVar3 != (xmlNodePtr)0x0);
          xmlUnlinkNode(tmp);
          xmlFreeNode(tmp);
          tmp = p_Var1;
        }
      }
    }
    else {
      do {
        tmp = p_Var1;
        if (tmp == (xmlNodePtr)0x0) {
          xmlUnlinkNode(pxVar3);
          xmlFreeNode(pxVar3);
          return 0;
        }
        p_Var1 = tmp->next;
        pxVar2 = xmlAddPrevSibling(pxVar3,tmp);
      } while (pxVar2 != (xmlNodePtr)0x0);
      xmlUnlinkNode(tmp);
      xmlFreeNode(tmp);
      tmp = p_Var1;
    }
    xmlXIncludeErrMemory(ctxt);
    xmlFreeNodeList(tmp);
  }
  return -1;
}

Assistant:

static int
xmlXIncludeIncludeNode(xmlXIncludeCtxtPtr ctxt, xmlXIncludeRefPtr ref) {
    xmlNodePtr cur, end, list, tmp;

    if ((ctxt == NULL) || (ref == NULL))
	return(-1);
    cur = ref->elem;
    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL))
	return(-1);

    list = ref->inc;
    ref->inc = NULL;

    /*
     * Check against the risk of generating a multi-rooted document
     */
    if ((cur->parent != NULL) &&
	(cur->parent->type != XML_ELEMENT_NODE)) {
	int nb_elem = 0;

	tmp = list;
	while (tmp != NULL) {
	    if (tmp->type == XML_ELEMENT_NODE)
		nb_elem++;
	    tmp = tmp->next;
	}
        if (nb_elem != 1) {
            if (nb_elem > 1)
                xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_MULTIPLE_ROOT,
                               "XInclude error: would result in multiple root "
                               "nodes\n", NULL);
            else
                xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_MULTIPLE_ROOT,
                               "XInclude error: would result in no root "
                               "node\n", NULL);
            xmlFreeNodeList(list);
	    return(-1);
	}
    }

    if (ctxt->parseFlags & XML_PARSE_NOXINCNODE) {
	/*
	 * Add the list of nodes
         *
         * TODO: Coalesce text nodes unless we are streaming mode.
	 */
	while (list != NULL) {
	    end = list;
	    list = list->next;

	    if (xmlAddPrevSibling(cur, end) == NULL) {
                xmlUnlinkNode(end);
                xmlFreeNode(end);
                goto err_memory;
            }
	}
	xmlUnlinkNode(cur);
	xmlFreeNode(cur);
    } else {
        xmlNodePtr child, next;

	/*
	 * Change the current node as an XInclude start one, and add an
	 * XInclude end one
	 */
        if (ref->fallback)
            xmlUnsetProp(cur, BAD_CAST "href");
	cur->type = XML_XINCLUDE_START;
        /* Remove fallback children */
        for (child = cur->children; child != NULL; child = next) {
            next = child->next;
            xmlUnlinkNode(child);
            xmlFreeNode(child);
        }
	end = xmlNewDocNode(cur->doc, cur->ns, cur->name, NULL);
	if (end == NULL)
            goto err_memory;
	end->type = XML_XINCLUDE_END;
	if (xmlAddNextSibling(cur, end) == NULL) {
            xmlFreeNode(end);
            goto err_memory;
        }

	/*
	 * Add the list of nodes
	 */
	while (list != NULL) {
	    cur = list;
	    list = list->next;

	    if (xmlAddPrevSibling(end, cur) == NULL) {
                xmlUnlinkNode(cur);
                xmlFreeNode(cur);
                goto err_memory;
            }
	}
    }


    return(0);

err_memory:
    xmlXIncludeErrMemory(ctxt);
    xmlFreeNodeList(list);
    return(-1);
}